

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbifnet.cpp
# Opt level: O2

void __thiscall
TadsHttpReqResult::TadsHttpReqResult
          (TadsHttpReqResult *this,vm_globalvar_t *idg,int status,CVmDataSource *reply,char *hdrs,
          char *loc)

{
  TadsEventMessage::TadsEventMessage(&this->super_TadsEventMessage,(OS_Event *)0x0);
  (this->super_TadsEventMessage).super_TadsMessage.super_CVmRefCntObj._vptr_CVmRefCntObj =
       (_func_int **)&PTR__TadsHttpReqResult_00343330;
  this->vmg = (vm_globals *)0x0;
  this->idg = idg;
  this->status = status;
  this->reply = reply;
  this->hdrs = hdrs;
  this->loc = loc;
  return;
}

Assistant:

TadsHttpReqResult(VMG_  vm_globalvar_t *idg, int status,
                      CVmDataSource *reply, char *hdrs, char *loc)
        : TadsEventMessage(0)
    {
        /* save the VM globals */
        vmg = VMGLOB_ADDR;

        /* save the ID global */
        this->idg = idg;

        /* remember the status */
        this->status = status;

        /* take ownership of the reply, headers, and location objects */
        this->reply = reply;
        this->hdrs = hdrs;
        this->loc = loc;
    }